

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::render_scene(Application *this,string *saveFileLocation)

{
  PathTracer *this_00;
  bool bVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  string local_38;
  
  set_up_pathtracer(this);
  PathTracer::start_raytracing(this->pathtracer);
  while( true ) {
    bVar1 = PathTracer::is_done(this->pathtracer);
    if (bVar1) break;
    local_40.__r = 5;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_40);
  }
  this_00 = this->pathtracer;
  std::__cxx11::string::string((string *)&local_38,(string *)saveFileLocation);
  PathTracer::save_image(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Application::render_scene(std::string saveFileLocation) {

  set_up_pathtracer();
  pathtracer->start_raytracing();

  while(!pathtracer->is_done()) {
    std::this_thread::sleep_for(std::chrono::milliseconds(5));
  }

  pathtracer->save_image(saveFileLocation);
}